

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

CURLcode mqtt_do(Curl_easy *data,_Bool *done)

{
  void *pvVar1;
  curltime cVar2;
  undefined4 uStack_34;
  CURLcode result;
  MQTT *mq;
  _Bool *done_local;
  Curl_easy *data_local;
  
  pvVar1 = Curl_meta_get(data,"meta:proto:mqtt:easy");
  *done = false;
  if (pvVar1 == (void *)0x0) {
    data_local._4_4_ = CURLE_FAILED_INIT;
  }
  else {
    cVar2 = Curl_now();
    *(time_t *)((long)pvVar1 + 0x58) = cVar2.tv_sec;
    *(ulong *)((long)pvVar1 + 0x60) = CONCAT44(uStack_34,cVar2.tv_usec);
    *(byte *)((long)pvVar1 + 0x69) = *(byte *)((long)pvVar1 + 0x69) & 0xfe;
    data_local._4_4_ = mqtt_connect(data);
    if (data_local._4_4_ == CURLE_OK) {
      mqstate(data,MQTT_FIRST,MQTT_CONNACK);
      data_local._4_4_ = CURLE_OK;
    }
    else {
      Curl_failf(data,"Error %d sending MQTT CONNECT request",(ulong)data_local._4_4_);
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode mqtt_do(struct Curl_easy *data, bool *done)
{
  struct MQTT *mq = Curl_meta_get(data, CURL_META_MQTT_EASY);
  CURLcode result = CURLE_OK;
  *done = FALSE; /* unconditionally */

  if(!mq)
    return CURLE_FAILED_INIT;
  mq->lastTime = Curl_now();
  mq->pingsent = FALSE;

  result = mqtt_connect(data);
  if(result) {
    failf(data, "Error %d sending MQTT CONNECT request", result);
    return result;
  }
  mqstate(data, MQTT_FIRST, MQTT_CONNACK);
  return CURLE_OK;
}